

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnoncontiguousbytedevice.cpp
# Opt level: O0

void __thiscall
QByteDeviceWrappingIoDevice::QByteDeviceWrappingIoDevice
          (QByteDeviceWrappingIoDevice *this,QNonContiguousByteDevice *bd)

{
  long lVar1;
  offset_in_QIODevice_to_subr in_RSI;
  offset_in_QIODevice_to_subr *in_RDI;
  long in_FS_OFFSET;
  offset_in_QNonContiguousByteDevice_to_subr unaff_retaddr;
  ConnectionType in_stack_00000020;
  OpenModeFlag in_stack_ffffffffffffff8c;
  Connection *in_stack_ffffffffffffff90;
  QObject *in_stack_ffffffffffffffa8;
  QIODevice *in_stack_ffffffffffffffb0;
  offset_in_QIODevice_to_subr *slot;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  slot = in_RDI;
  QIODevice::QIODevice(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *in_RDI = (offset_in_QIODevice_to_subr)&PTR_metaObject_00be3438;
  in_RDI[2] = in_RSI;
  QObject::connect<void(QNonContiguousByteDevice::*)(),void(QIODevice::*)()>
            ((Object *)QIODevice::readyRead,unaff_retaddr,
             (ContextType *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),slot,
             in_stack_00000020);
  QMetaObject::Connection::~Connection(in_stack_ffffffffffffff90);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff8c);
  (**(code **)(*in_RDI + 0x68))(in_RDI,in_stack_ffffffffffffffdc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QByteDeviceWrappingIoDevice::QByteDeviceWrappingIoDevice(QNonContiguousByteDevice *bd)
    : QIODevice(nullptr), byteDevice(bd)
{
    connect(bd, &QNonContiguousByteDevice::readyRead, this, &QIODevice::readyRead);

    open(ReadOnly);
}